

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_testing::internal::CastAndAppendTransform<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_3UL>
::operator()(IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_3UL>
             *this,tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
                   *param_2,
            IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_3UL>
            *param_3)

{
  __tuple_element_t<0UL,_tuple<shared_ptr<const_ParsedCertificate>,_shared_ptr<const_ParsedCertificate>,_shared_ptr<const_ParsedCertificate>_>_>
  *a;
  back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
  *this_00;
  back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
  bVar1;
  IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_2UL>
  local_5d [13];
  back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
  local_50;
  Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&> local_48;
  tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
  *local_30;
  tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
  *t_local;
  IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_3UL>
  *this_local;
  back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
  out_local;
  
  local_30 = param_2;
  t_local = (tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
             *)this;
  this_local = param_3;
  a = std::
      get<0ul,std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                (param_2);
  CastAndAppendTransform<std::shared_ptr<bssl::ParsedCertificate_const>const&>::operator()
            (&local_48,
             (CastAndAppendTransform<std::shared_ptr<bssl::ParsedCertificate_const>const&> *)
             ((long)&out_local.container + 7),a);
  local_50 = std::
             back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
             ::operator++((back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
                           *)&this_local,0);
  this_00 = std::
            back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
            ::operator*(&local_50);
  std::
  back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
  ::operator=(this_00,&local_48);
  Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>::~Matcher(&local_48);
  bVar1 = IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_2UL>
          ::operator()(local_5d,local_30,this_local);
  return (back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }